

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void __thiscall ExampleAppLog::ExampleAppLog(ExampleAppLog *this)

{
  ExampleAppLog *in_RDI;
  char *in_stack_ffffffffffffffe8;
  ImGuiTextFilter *in_stack_fffffffffffffff0;
  
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x123420);
  ImGuiTextFilter::ImGuiTextFilter(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  ImVector<int>::ImVector(&in_RDI->LineOffsets);
  in_RDI->AutoScroll = true;
  Clear(in_RDI);
  return;
}

Assistant:

ExampleAppLog()
    {
        AutoScroll = true;
        Clear();
    }